

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trd.c
# Opt level: O0

void trdmain1(errcxdef *ec,int argc,char **argv,appctxdef *appctx,char *save_ext)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  FILE *__stream;
  long lVar6;
  long lVar7;
  runsdef *prVar8;
  uchar *puVar9;
  long *in_RCX;
  long *in_RDX;
  int in_ESI;
  errcxdef *in_RDI;
  undefined8 in_R8;
  bool bVar10;
  errdef fr_;
  int use_exe;
  ulong endpos;
  ulong curpos;
  osfildef *fp;
  char *p;
  int doublespace;
  int charmap_none;
  char *charmap;
  char *restore_file;
  int safety_write;
  int safety_read;
  ulong totsize;
  int preload;
  uchar *myheap;
  runsdef *mystack;
  uint stksiz;
  uint heapsiz;
  objnum preinit;
  uint flags;
  objucxdef *undoptr;
  ushort undosiz;
  ulong cachelimit;
  char inbuf [4096];
  int loadopen;
  fiolcxdef fiolctx;
  int pause;
  int i;
  int swapena;
  ulong swapsize;
  char *exefile;
  char infile_path [4096];
  char infile_abs [4096];
  char *infile;
  char *arg;
  char **argp;
  char swapbuf [4096];
  char *swapname;
  supcxdef supctx;
  dbgcxdef dbg;
  mcmcx1def *globalctx;
  mcmcxdef *mctx;
  _func_void_bifcxdef_ptr_int *bif [100];
  voccxdef vocctx;
  bifcxdef bifctx;
  runcxdef runctx;
  osfildef *swapfp;
  errdef *in_stack_ffffffffffff9278;
  errcxdef *in_stack_ffffffffffff9280;
  int ofs;
  objucxdef *undoctx;
  runcxdef *in_stack_ffffffffffff9288;
  errcxdef *in_stack_ffffffffffff9290;
  int prv;
  runcxdef *runctx_00;
  errcxdef *in_stack_ffffffffffff9298;
  voccxdef *in_stack_ffffffffffff92a0;
  undefined4 in_stack_ffffffffffff92a8;
  uint in_stack_ffffffffffff92ac;
  mcmcx1def *in_stack_ffffffffffff92b0;
  undefined8 in_stack_ffffffffffff92b8;
  tokpdef *local_6d40;
  int local_6d2c;
  errdef *local_6d20;
  int local_6d18;
  errcxdef *in_stack_ffffffffffff9390;
  errcxdef *in_stack_ffffffffffff93d8;
  char *in_stack_ffffffffffff93e0;
  osfildef *in_stack_ffffffffffff93e8;
  ulong in_stack_ffffffffffff93f0;
  uint in_stack_ffffffffffff93fc;
  ulong in_stack_ffffffffffff9400;
  char *pcVar11;
  int local_6ba8;
  int local_6ba4;
  uint local_6b80;
  uint local_6b7c;
  objucxdef *local_6b70;
  short local_6b62;
  char local_6b58 [3592];
  char *in_stack_ffffffffffffa2b0;
  size_t in_stack_ffffffffffffa2b8;
  char *in_stack_ffffffffffffa2c0;
  fiolcxdef *in_stack_ffffffffffffa478;
  char *in_stack_ffffffffffffa480;
  char *in_stack_ffffffffffffa488;
  tokcxdef *in_stack_ffffffffffffa490;
  voccxdef *in_stack_ffffffffffffa498;
  mcmcxdef *in_stack_ffffffffffffa4a0;
  int local_5b24;
  int iVar12;
  int iVar13;
  uint *flagp;
  uchar **in_stack_ffffffffffffa4f8;
  uint *in_stack_ffffffffffffa500;
  uint *in_stack_ffffffffffffa508;
  int in_stack_ffffffffffffa510;
  appctxdef *in_stack_ffffffffffffa518;
  char *in_stack_ffffffffffffa520;
  char *local_3b00;
  long *local_3af0;
  char *in_stack_ffffffffffffcb20;
  objnum in_stack_ffffffffffffcb2e;
  tiocxdef *in_stack_ffffffffffffcb30;
  voccxdef *in_stack_ffffffffffffcb38;
  runcxdef *in_stack_ffffffffffffcb40;
  errcxdef *local_2ae0;
  mcmcxdef *local_2ad8;
  voccxdef *local_2ad0;
  undefined8 local_2ac8;
  runcxdef *local_2ac0;
  undefined8 local_2ab8;
  undefined2 local_2ab0;
  dbgcxdef local_2aa8;
  mcmcx1def *local_1798;
  mcmcxdef *local_1790;
  _func_void_bifcxdef_ptr_int *local_1788 [100];
  voccxdef local_1468;
  errcxdef *local_2a8;
  runcxdef *local_2a0;
  undefined8 local_298;
  undefined8 local_290;
  undefined4 local_27c;
  int local_1d8;
  int local_1d4;
  undefined8 local_1d0;
  long *local_1c8;
  re_context rStack_1c0;
  runcxdef local_e8;
  osfildef *local_40;
  undefined8 local_38;
  long *local_30;
  long *local_28;
  int local_1c;
  errcxdef *local_18;
  
  local_40 = (osfildef *)0x0;
  local_1790 = (mcmcxdef *)0x0;
  local_1798 = (mcmcx1def *)0x0;
  flagp = (uint *)0xffffffff;
  iVar13 = 0;
  local_5b24 = 0;
  local_6b62 = -0x15a0;
  local_6b7c = 0xffff;
  local_6b80 = 0x200;
  pcVar11 = (char *)0x0;
  local_38 = in_R8;
  local_30 = in_RCX;
  local_28 = in_RDX;
  local_1c = in_ESI;
  local_18 = in_RDI;
  out_init();
  local_6ba8 = 2;
  local_6ba4 = 2;
  bVar2 = false;
  iVar12 = 1;
  local_3af0 = local_28;
  while( true ) {
    iVar3 = (int)in_stack_ffffffffffff92b8;
    local_3af0 = local_3af0 + 1;
    if ((local_1c <= iVar12) || (pcVar5 = (char *)*local_3af0, *pcVar5 != '-')) break;
    iVar3 = (int)in_stack_ffffffffffff9288;
    iVar4 = (int)((ulong)in_stack_ffffffffffff9288 >> 0x20);
    switch(pcVar5[1]) {
    case 'c':
      iVar3 = strcmp(pcVar5 + 1,"ctab");
      if (iVar3 == 0) {
        cmdarg((errcxdef *)in_stack_ffffffffffff92a0,(char ***)in_stack_ffffffffffff9298,
               (int *)in_stack_ffffffffffff9290,(int)((ulong)in_stack_ffffffffffff9288 >> 0x20),
               (int)in_stack_ffffffffffff9288,(_func_void_errcxdef_ptr *)in_stack_ffffffffffff9280);
      }
      else {
        iVar3 = strcmp(pcVar5 + 1,"ctab-");
        if (iVar3 == 0) {
          bVar2 = true;
        }
        else {
          trdusage(in_stack_ffffffffffff9390);
        }
      }
      break;
    case 'd':
      iVar3 = strnicmp((char *)in_stack_ffffffffffff9280,(char *)in_stack_ffffffffffff9278,0x229985)
      ;
      if (iVar3 == 0) {
        iVar3 = cmdtog(in_stack_ffffffffffff9298,(int)((ulong)in_stack_ffffffffffff9290 >> 0x20),
                       (char *)in_stack_ffffffffffff9288,
                       (int)((ulong)in_stack_ffffffffffff9280 >> 0x20),
                       (_func_void_errcxdef_ptr *)in_stack_ffffffffffff9278);
        out_set_doublespace(iVar3);
      }
      break;
    default:
      trdusage(in_stack_ffffffffffff9390);
      break;
    case 'i':
      cmdarg((errcxdef *)in_stack_ffffffffffff92a0,(char ***)in_stack_ffffffffffff9298,
             (int *)in_stack_ffffffffffff9290,iVar4,iVar3,
             (_func_void_errcxdef_ptr *)in_stack_ffffffffffff9280);
      qasopn((char *)in_stack_ffffffffffff9278,0);
      break;
    case 'l':
      pcVar5 = cmdarg((errcxdef *)in_stack_ffffffffffff92a0,(char ***)in_stack_ffffffffffff9298,
                      (int *)in_stack_ffffffffffff9290,iVar4,iVar3,
                      (_func_void_errcxdef_ptr *)in_stack_ffffffffffff9280);
      logfp = (osfildef *)fopen(pcVar5,"w");
      break;
    case 'm':
      if (pcVar5[2] == 'h') {
        pcVar5 = cmdarg((errcxdef *)in_stack_ffffffffffff92a0,(char ***)in_stack_ffffffffffff9298,
                        (int *)in_stack_ffffffffffff9290,iVar4,iVar3,
                        (_func_void_errcxdef_ptr *)in_stack_ffffffffffff9280);
        local_6b7c = atoi(pcVar5);
      }
      else if (pcVar5[2] == 's') {
        pcVar5 = cmdarg((errcxdef *)in_stack_ffffffffffff92a0,(char ***)in_stack_ffffffffffff9298,
                        (int *)in_stack_ffffffffffff9290,iVar4,iVar3,
                        (_func_void_errcxdef_ptr *)in_stack_ffffffffffff9280);
        local_6b80 = atoi(pcVar5);
      }
      else {
        pcVar5 = cmdarg((errcxdef *)in_stack_ffffffffffff92a0,(char ***)in_stack_ffffffffffff9298,
                        (int *)in_stack_ffffffffffff9290,iVar4,iVar3,
                        (_func_void_errcxdef_ptr *)in_stack_ffffffffffff9280);
        atol(pcVar5);
      }
      break;
    case 'n':
      iVar3 = strcmp(pcVar5,"-nobanner");
      if (iVar3 != 0) {
        trdusage(in_stack_ffffffffffff9390);
      }
      break;
    case 'o':
      pcVar5 = cmdarg((errcxdef *)in_stack_ffffffffffff92a0,(char ***)in_stack_ffffffffffff9298,
                      (int *)in_stack_ffffffffffff9290,iVar4,iVar3,
                      (_func_void_errcxdef_ptr *)in_stack_ffffffffffff9280);
      cmdfile = (osfildef *)fopen(pcVar5,"w");
      break;
    case 'p':
      iVar3 = stricmp((char *)in_stack_ffffffffffff9280,(char *)in_stack_ffffffffffff9278);
      if (iVar3 == 0) {
        os_plain();
      }
      else {
        local_5b24 = cmdtog(in_stack_ffffffffffff9298,
                            (int)((ulong)in_stack_ffffffffffff9290 >> 0x20),
                            (char *)in_stack_ffffffffffff9288,
                            (int)((ulong)in_stack_ffffffffffff9280 >> 0x20),
                            (_func_void_errcxdef_ptr *)in_stack_ffffffffffff9278);
      }
      break;
    case 'r':
      pcVar11 = cmdarg((errcxdef *)in_stack_ffffffffffff92a0,(char ***)in_stack_ffffffffffff9298,
                       (int *)in_stack_ffffffffffff9290,iVar4,iVar3,
                       (_func_void_errcxdef_ptr *)in_stack_ffffffffffff9280);
      break;
    case 's':
      pcVar5 = cmdarg((errcxdef *)in_stack_ffffffffffff92a0,(char ***)in_stack_ffffffffffff9298,
                      (int *)in_stack_ffffffffffff9290,iVar4,iVar3,
                      (_func_void_errcxdef_ptr *)in_stack_ffffffffffff9280);
      if (*pcVar5 == '?') {
        trdusage_s((errcxdef *)0x229a25);
      }
      local_6ba4 = *pcVar5 + -0x30;
      local_6d2c = local_6ba4;
      if (pcVar5[1] != '\0') {
        local_6d2c = pcVar5[1] + -0x30;
      }
      local_6ba8 = local_6d2c;
      if (((local_6ba4 < 0) || (4 < local_6ba4)) || ((local_6d2c < 0 || (4 < local_6d2c)))) {
        trdusage_s((errcxdef *)0x229aab);
      }
      if ((local_30 != (long *)0x0) && (local_30[0x15] != 0)) {
        (*(code *)local_30[0x15])(local_30[0x17],local_6ba4,local_6d2c);
      }
      break;
    case 't':
      cVar1 = pcVar5[2];
      if (cVar1 == 'f') {
        cmdarg((errcxdef *)in_stack_ffffffffffff92a0,(char ***)in_stack_ffffffffffff9298,
               (int *)in_stack_ffffffffffff9290,iVar4,iVar3,
               (_func_void_errcxdef_ptr *)in_stack_ffffffffffff9280);
      }
      else {
        ofs = (int)((ulong)in_stack_ffffffffffff9280 >> 0x20);
        prv = (int)((ulong)in_stack_ffffffffffff9290 >> 0x20);
        if (cVar1 == 'p') {
          cmdtog(in_stack_ffffffffffff9298,prv,(char *)in_stack_ffffffffffff9288,ofs,
                 (_func_void_errcxdef_ptr *)in_stack_ffffffffffff9278);
        }
        else if (cVar1 == 's') {
          pcVar5 = cmdarg((errcxdef *)in_stack_ffffffffffff92a0,(char ***)in_stack_ffffffffffff9298,
                          (int *)in_stack_ffffffffffff9290,iVar4,iVar3,
                          (_func_void_errcxdef_ptr *)in_stack_ffffffffffff9280);
          flagp = (uint *)atol(pcVar5);
        }
        else {
          iVar13 = cmdtog(in_stack_ffffffffffff9298,prv,(char *)in_stack_ffffffffffff9288,ofs,
                          (_func_void_errcxdef_ptr *)in_stack_ffffffffffff9278);
        }
      }
      break;
    case 'u':
      pcVar5 = cmdarg((errcxdef *)in_stack_ffffffffffff92a0,(char ***)in_stack_ffffffffffff9298,
                      (int *)in_stack_ffffffffffff9290,iVar4,iVar3,
                      (_func_void_errcxdef_ptr *)in_stack_ffffffffffff9280);
      iVar3 = atoi(pcVar5);
      local_6b62 = (short)iVar3;
    }
    iVar12 = iVar12 + 1;
  }
  local_6d40 = (tokpdef *)0x0;
  if (iVar12 == local_1c) {
    local_3b00 = (char *)0x0;
    bVar10 = false;
    if ((pcVar11 != (char *)0x0) &&
       (iVar4 = fiorso_getgame((char *)CONCAT44(in_stack_ffffffffffff92ac,in_stack_ffffffffffff92a8)
                               ,(char *)in_stack_ffffffffffff92a0,(size_t)in_stack_ffffffffffff9298)
       , iVar4 != 0)) {
      local_3b00 = local_6b58;
    }
    if (local_3b00 == (char *)0x0) {
      if ((local_28 == (long *)0x0) || (*local_28 == 0)) {
        local_6d40 = (tokpdef *)0x3a786f;
      }
      else {
        local_6d40 = (tokpdef *)*local_28;
      }
      __stream = (FILE *)os_exeseek((char *)local_6d40,"TGAM");
      if (__stream != (FILE *)0x0) {
        lVar6 = ftell(__stream);
        fseek(__stream,0,2);
        lVar7 = ftell(__stream);
        fclose(__stream);
        bVar10 = lVar7 != lVar6;
      }
    }
    if ((local_3b00 == (char *)0x0) && (!bVar10)) {
      if ((local_30 == (long *)0x0) || (*local_30 == 0)) {
        trdusage(in_stack_ffffffffffff9390);
      }
      else {
        iVar4 = (*(code *)*local_30)(local_30[1],local_6b58,0x1000);
        if (iVar4 == 0) {
          trdptf("\n");
          trdptf("(No game has been selected.)\n");
          return;
        }
        local_3b00 = local_6b58;
      }
    }
  }
  else {
    local_3b00 = (char *)*local_3af0;
    if (iVar12 + 1 != local_1c) {
      trdusage(in_stack_ffffffffffff9390);
    }
    iVar4 = access(local_3b00,0);
    if (iVar4 != 0) {
      strcpy(local_6b58,local_3b00);
      os_defext((char *)in_stack_ffffffffffff9290,(char *)in_stack_ffffffffffff9288);
      local_3b00 = local_6b58;
    }
  }
  if (((iVar13 != 0) && (flagp != (uint *)0x0)) &&
     (local_40 = os_create_tempfile((char *)in_stack_ffffffffffff9278,(char *)0x22a063),
     local_40 == (osfildef *)0x0)) {
    errsigf(in_stack_ffffffffffff9280,(char *)in_stack_ffffffffffff9278,0);
  }
  if (bVar2) {
    cmap_override();
  }
  else {
    iVar4 = cmap_load((char *)in_stack_ffffffffffff9278);
    if (iVar4 != 0) {
      errsigf(in_stack_ffffffffffff9280,(char *)in_stack_ffffffffffff9278,0);
    }
  }
  local_6d18 = _setjmp((__jmp_buf_tag *)&stack0xffffffffffff9350);
  if (local_6d18 == 0) {
    local_6d20 = local_18->errcxptr;
    local_18->errcxptr = (errdef *)&local_6d20;
    local_1798 = mcmini(in_stack_ffffffffffff9400,in_stack_ffffffffffff93fc,
                        in_stack_ffffffffffff93f0,in_stack_ffffffffffff93e8,
                        in_stack_ffffffffffff93e0,in_stack_ffffffffffff93d8);
    iVar4 = (int)((ulong)in_stack_ffffffffffff9278 >> 0x20);
    local_1790 = mcmcini(in_stack_ffffffffffff92b0,in_stack_ffffffffffff92ac,
                         (_func_void_void_ptr_mclhd_uchar_ptr_ushort *)in_stack_ffffffffffff92a0,
                         in_stack_ffffffffffff9298,
                         (_func_void_void_ptr_mcmon *)in_stack_ffffffffffff9290,
                         in_stack_ffffffffffff9288);
    local_1790->mcmcxrvc = local_1790;
    if (local_6b62 == 0) {
      local_6b70 = (objucxdef *)0x0;
    }
    else {
      local_6b70 = objuini((mcmcxdef *)in_stack_ffffffffffff92a0,
                           (ushort)((ulong)in_stack_ffffffffffff9298 >> 0x30),
                           (_func_void_void_ptr_uchar_ptr *)in_stack_ffffffffffff9290,
                           (_func_ushort_void_ptr_uchar_ptr *)in_stack_ffffffffffff9288,
                           in_stack_ffffffffffff9280);
    }
    undoctx = (objucxdef *)CONCAT44((int)((ulong)in_stack_ffffffffffff9280 >> 0x20),200);
    vocini(in_stack_ffffffffffff92a0,in_stack_ffffffffffff9298,(mcmcxdef *)in_stack_ffffffffffff9290
           ,in_stack_ffffffffffff9288,undoctx,iVar4,(int)in_stack_ffffffffffff92b0,iVar3);
    main_voc_ctx = &local_1468;
    prVar8 = (runsdef *)
             mchalo(in_stack_ffffffffffff9290,(size_t)in_stack_ffffffffffff9288,(char *)undoctx);
    puVar9 = mchalo(in_stack_ffffffffffff9290,(size_t)in_stack_ffffffffffff9288,(char *)undoctx);
    iVar3 = (int)((ulong)undoctx >> 0x20);
    if (local_3b00 == (char *)0x0) {
      if (local_6d40 != (tokpdef *)0x0) {
        os_get_abs_filename(in_stack_ffffffffffffa2c0,in_stack_ffffffffffffa2b8,
                            in_stack_ffffffffffffa2b0);
      }
    }
    else {
      os_get_abs_filename(in_stack_ffffffffffffa2c0,in_stack_ffffffffffffa2b8,
                          in_stack_ffffffffffffa2b0);
    }
    os_get_path_name((char *)in_stack_ffffffffffff92b0,
                     CONCAT44(in_stack_ffffffffffff92ac,in_stack_ffffffffffff92a8),
                     (char *)in_stack_ffffffffffff92a0);
    local_e8.runcxerr = local_18;
    local_e8.runcxmem = local_1790;
    local_e8.runcxstop = prVar8 + local_6b80;
    local_e8.runcxhtop = puVar9 + local_6b7c;
    local_e8.runcxundo = local_6b70;
    local_e8.runcxbcx = &local_2a8;
    local_e8.runcxbi = local_1788;
    local_e8.runcxtio = (tiocxdef *)0x0;
    local_e8.runcxdbg = &local_2aa8;
    local_e8.runcxvoc = &local_1468;
    local_e8.runcxdmd = supcont;
    local_e8.runcxdmc = &local_2ae0;
    local_e8.runcxext = (runxdef *)0x0;
    local_e8.runcxgamename = local_3b00;
    local_e8.runcxgamepath = &stack0xffffffffffffa4f8;
    local_2ae0 = local_18;
    local_2ad8 = local_1790;
    local_2ac8 = 0;
    local_2ab8 = 0;
    local_2ab0 = 0;
    local_2ad0 = &local_1468;
    local_2ac0 = &local_e8;
    local_2aa8.dbgcxtio = (tiocxdef *)0x0;
    local_2aa8.dbgcxmem = local_1790;
    local_2aa8.dbgcxerr = local_18;
    local_2aa8.dbgcxtab = (tokthdef *)0x0;
    local_2aa8.dbgcxfcn = 0;
    local_2aa8.dbgcxdep = 0;
    local_2aa8.dbgcxflg = 0;
    local_2aa8.dbgcxlin = (lindef *)0x0;
    local_e8.runcxstk = prVar8;
    local_e8.runcxsp = prVar8;
    local_e8.runcxbp = prVar8;
    local_e8.runcxheap = puVar9;
    local_e8.runcxhp = puVar9;
    memset(&local_2a8,0,0x1c0);
    local_2a8 = local_18;
    local_2a0 = &local_e8;
    local_298 = 0;
    local_290 = 0;
    local_27c = 0;
    local_1c8 = local_30;
    local_1d8 = local_6ba4;
    local_1d4 = local_6ba8;
    local_1d0 = local_38;
    re_init(&rStack_1c0,local_18);
    supbif((supcxdef *)in_stack_ffffffffffff9290,
           (_func_void_bifcxdef_ptr_int **)in_stack_ffffffffffff9288,iVar3);
    runistat(&local_1468,&local_e8,(tiocxdef *)0x0);
    runctx_00 = (runcxdef *)0x0;
    fiord(in_stack_ffffffffffffa4a0,in_stack_ffffffffffffa498,in_stack_ffffffffffffa490,
          in_stack_ffffffffffffa488,in_stack_ffffffffffffa480,in_stack_ffffffffffffa478,
          (objnum *)CONCAT44(iVar13,iVar12),flagp,local_6d40,in_stack_ffffffffffffa4f8,
          in_stack_ffffffffffffa500,in_stack_ffffffffffffa508,in_stack_ffffffffffffa510,
          in_stack_ffffffffffffa518,in_stack_ffffffffffffa520);
    plygo(in_stack_ffffffffffffcb40,in_stack_ffffffffffffcb38,in_stack_ffffffffffffcb30,
          in_stack_ffffffffffffcb2e,in_stack_ffffffffffffcb20);
    fiorcls((fiolcxdef *)0x22a745);
    if (local_5b24 != 0) {
      trdptf("[press a key to exit]");
      os_waitc();
      trdptf("\n");
    }
    trd_close_swapfile(runctx_00);
    qasclose();
    local_18->errcxptr = local_6d20;
    main_voc_ctx = (voccxdef *)0x0;
    vocterm((voccxdef *)0x22a85d);
    if (local_6b70 != (objucxdef *)0x0) {
      objuterm((objucxdef *)0x22a875);
    }
    mcmcterm((mcmcxdef *)0x22a882);
    mcmterm((mcmcx1def *)runctx_00);
    return;
  }
  local_18->errcxptr = local_6d20;
  trd_close_swapfile((runcxdef *)in_stack_ffffffffffff9290);
  main_voc_ctx = (voccxdef *)0x0;
  vocterm((voccxdef *)0x22a7e8);
  if (local_1790 != (mcmcxdef *)0x0) {
    mcmcterm((mcmcxdef *)0x22a818);
  }
  if (local_1798 != (mcmcx1def *)0x0) {
    mcmterm((mcmcx1def *)in_stack_ffffffffffff9290);
  }
  errrse1(in_stack_ffffffffffff9280,in_stack_ffffffffffff9278);
}

Assistant:

static void trdmain1(errcxdef *ec, int argc, char *argv[],
                     appctxdef *appctx, char *save_ext)
{
    osfildef  *swapfp = (osfildef *)0;
    runcxdef   runctx;
    bifcxdef   bifctx;
    voccxdef   vocctx;
    void     (*bif[100])(struct bifcxdef *, int);
    mcmcxdef  *mctx = 0;
    mcmcx1def *globalctx = 0;
    dbgcxdef   dbg;
    supcxdef   supctx;
    char      *swapname = 0;
    char       swapbuf[OSFNMAX];
    char     **argp;
    char      *arg;
    char      *infile;
    char       infile_abs[OSFNMAX];      /* fully-qualified input file name */
    char       infile_path[OSFNMAX];         /* absolute path to input file */
    char      *exefile;            /* try with executable file if no infile */
    ulong      swapsize = 0xffffffffL;        /* allow unlimited swap space */
    int        swapena = OS_DEFAULT_SWAP_ENABLED;      /* swapping enabled? */
    int        i;
    int        pause = FALSE;                 /* pause after finishing game */
    fiolcxdef  fiolctx;
    noreg int  loadopen = FALSE;
    char       inbuf[OSFNMAX];
    ulong      cachelimit = 0xffffffff;
    ushort     undosiz = TRD_UNDOSIZ;      /* default undo context size 16k */
    objucxdef *undoptr = 0;
    uint       flags;         /* flags used to write the file we're reading */
    objnum     preinit;         /* preinit object, if we need to execute it */
    uint       heapsiz = TRD_HEAPSIZ;
    uint       stksiz = TRD_STKSIZ;
    runsdef   *mystack;
    uchar     *myheap;
    extern osfildef *cmdfile;     /* hacky v1 qa interface - command log fp */
    extern osfildef *logfp;        /* hacky v1 qa interface - output log fp */
    int        preload = FALSE;              /* TRUE => preload all objects */
    ulong      totsize;
    extern voccxdef *main_voc_ctx;
    int        safety_read, safety_write;          /* file I/O safety level */
    char      *restore_file = 0;                    /* .SAV file to restore */
    char      *charmap = 0;                           /* character map file */
    int        charmap_none;       /* explicitly do not use a character set */
	int        doublespace = TRUE;        /* formatter double-space setting */
    
    NOREG((&loadopen))

    /* initialize the output formatter */
    out_init();

    /* set safety level to 2 by default - read any/write current dir only */
    safety_read = safety_write = 2;

    /* no -ctab- yet */
    charmap_none = FALSE;

    /* parse arguments */
    for (i = 1, argp = argv + 1 ; i < argc ; ++argp, ++i)
    {
        arg = *argp;
        if (*arg == '-')
        {
            switch(*(arg+1))
            {
            case 'c':
                if (!strcmp(arg+1, "ctab"))
                {
                    /* get the character mapping table */
                    charmap = cmdarg(ec, &argp, &i, argc, 4, trdusage);
                }
                else if (!strcmp(arg+1, "ctab-"))
                {
                    /* use the default mapping */
                    charmap_none = TRUE;
                }
                else
                    trdusage(ec);
                break;
                     
            case 'r':
                /* restore a game */
                restore_file = cmdarg(ec, &argp, &i, argc, 1, trdusage);
                break;
                
            case 'i':
                qasopn(cmdarg(ec, &argp, &i, argc, 1, trdusage), TRUE);
                break;
                
            case 'o':
                cmdfile = osfopwt(cmdarg(ec, &argp, &i, argc, 1, trdusage),
                                  OSFTCMD);
                break;
                
            case 'l':
                logfp = osfopwt(cmdarg(ec, &argp, &i, argc, 1, trdusage),
                                OSFTCMD);
                break;

            case 'p':
                if (!stricmp(arg, "-plain"))
                {
                    os_plain();
                    break;
                }
                pause = cmdtog(ec, pause, arg, 1, trdusage);
                break;

            case 'd':
                if (!strnicmp(arg, "-double", 7))
                {
                    /* get the argument value */
                    doublespace = cmdtog(ec, doublespace, arg, 6, trdusage);

                    /* set the double-space mode in the formatter */
                    out_set_doublespace(doublespace);
                    break;
                }
                break;

            case 's':
                {
                    char *p;

                    /* get the option */
                    p = cmdarg(ec, &argp, &i, argc, 1, trdusage);

                    /* if they're asking for help, display detailed usage */
                    if (*p == '?')
                        trdusage_s(ec);

                    /* get the safety level from the argument */
                    safety_read = *p - '0';
                    safety_write = (*(p+1) != '\0' ? *(p+1) - '0' :
                                    safety_read);

                    /* range-check the values */
                    if (safety_read < 0 || safety_read > 4
                        || safety_write < 0 || safety_write > 4)
                        trdusage_s(ec);

                    /* tell the host system about the setting */
                    if (appctx != 0 && appctx->set_io_safety_level != 0)
                        (*appctx->set_io_safety_level)
                            (appctx->io_safety_level_ctx,
                             safety_read, safety_write);
                }
                break;
                
            case 'm':
                switch(*(arg + 2))
                {
                case 's':
                    stksiz = atoi(cmdarg(ec, &argp, &i, argc, 2, trdusage));
                    break;
                    
                case 'h':
                    heapsiz = atoi(cmdarg(ec, &argp, &i, argc, 2, trdusage));
                    break;
                    
                default:
                    cachelimit = atol(cmdarg(ec, &argp, &i, argc, 1,
                                             trdusage));
                    break;
                }
				break;

			case 'n':
				/* 
				 *   -nobanner was already parsed and handled by our caller,
				 *   but it's still in the argument list, so just skip it;
				 *   anything else starting with -n is invalid
				 */
				if (strcmp(arg, "-nobanner") != 0)
					trdusage(ec);
				break;

            case 't':
                /* swap file options:  -tf file, -ts size, -t- (no swap) */
                switch(*(arg+2))
                {
                case 'f':
                    swapname = cmdarg(ec, &argp, &i, argc, 2, trdusage);
                    break;
                    
                case 's':
                    swapsize = atol(cmdarg(ec, &argp, &i, argc, 2, trdusage));
                    break;
                    
                case 'p':
                    preload = cmdtog(ec, preload, arg, 2, trdusage);
                    break;
                    
                default:
                    swapena = cmdtog(ec, swapena, arg, 1, trdusage);
                    break;
                }
                break;
                
            case 'u':
                undosiz = atoi(cmdarg(ec, &argp, &i, argc, 1, trdusage));
                break;
                
            default:
                trdusage(ec);
            }
        }
        else break;
    }

    /* presume we won't take the .gam from the application executable */
    exefile = 0;

    /* get input name argument, and make sure it's the last argument */
    if (i == argc)
    {
        osfildef *fp;
        ulong     curpos;
        ulong     endpos;
        int       use_exe;

        /*
         *   There's no input name argument, so we need to find the game
         *   to play some other way.  First, check to see if we have a
         *   game to restore, and if so whether it has the .GAM name
         *   encoded into it.  Next, look to see if there's a game
         *   attached to the executable file; if so, use it.  If not, see
         *   if the host system wants to provide a name through its
         *   callback.  
         */
        
        /* presume we won't find a game attached to the executable file */
        infile = 0;
        use_exe = FALSE;

        /* 
         *   see if we have a saved game to restore, and it specifies the
         *   GAM file that saved it 
         */
        if (restore_file != 0)
        {
            /* try getting the game name from the restore file */
            if (fiorso_getgame(restore_file, inbuf, sizeof(inbuf)))
            {
                /* got it - use this file */
                infile = inbuf;
            }
        }
        
        /* 
         *   it that didn't work, try to read from os-dependent part of
         *   program being executed 
         */
        if (infile == 0)
        {
            /* try opening the executable file */
            exefile = (argv && argv[0] ? argv[0] : "TRX");
            fp = os_exeseek(exefile, "TGAM");
            if (fp != 0)
            {
                /* see if there's a game file attached to the executable */
                curpos = osfpos(fp);
                osfseek(fp, 0L, OSFSK_END);
                endpos = osfpos(fp);
                osfcls(fp);
                
                /* if we found it, use it */
                if (endpos != curpos)
                    use_exe = TRUE;
            }
        }
            
        /* 
         *   if we didn't find a game in the executable, try the host
         *   system callback 
         */
        if (infile == 0 && !use_exe)
        {
            /* 
             *   ask the host system callback what to do - if we don't
             *   have a host system callback, or the callback 
             */
            if (appctx != 0 && appctx->get_game_name != 0)
            {
                /* call the host system callback */
                if ((*appctx->get_game_name)(appctx->get_game_name_ctx,
                                             inbuf, sizeof(inbuf)))
                {
                    /* the host system provided a name - use it */
                    infile = inbuf;
                }
                else
                {
                    /* 
                     *   the host didn't provide a name - simply display a
                     *   message indicating that no game file has been
                     *   chosen, and return 
                     */
                    trdptf("\n");
                    trdptf("(No game has been selected.)\n");
                    return;
                }
            }
            else
            {
                /* 
                 *   we've run out of ways to get a filename - give the
                 *   user the usage message and quit 
                 */
                trdusage(ec);
            }
        }
    }
    else
    {
        infile = *argp;
        if (i + 1 != argc)
            trdusage(ec);

#ifndef OS_HATES_EXTENSIONS
        /*
         *   If original name exists, use it; otherwise, try adding .GAM.
         *   Note that this code is ifdef'd so that platforms that don't
         *   use filename extensions in the manner conventional for DOS
         *   and Unix won't use this code. 
         */
        if (osfacc(infile))
        {
            strcpy(inbuf, infile);
            os_defext(inbuf, "gam");
            infile = inbuf;
        }
#endif /* !defined(OS_HATES_EXTENSIONS) */
    }
    
    /* open up the swap file */
    if (swapena && swapsize)
    {
        swapfp = os_create_tempfile(swapname, swapbuf);
        if (swapname == 0) swapname = swapbuf;
        if (swapfp == 0) errsig(ec, ERR_OPSWAP);
    }
    
    /* load the character map */
    if (charmap_none)
        cmap_override();
    else if (cmap_load(charmap))
        errsig(ec, ERR_INVCMAP);

    ERRBEGIN(ec)

    /* initialize cache manager context */
    globalctx = mcmini(cachelimit, 128, swapsize, swapfp, swapname, ec);
    mctx = mcmcini(globalctx, 128, fioldobj, &fiolctx,
                   objrevert, (void *)0);
    mctx->mcmcxrvc = mctx;

    /* set up an undo context */
    if (undosiz)
        undoptr = objuini(mctx, undosiz, vocdundo, vocdusz, &vocctx);
    else
        undoptr = (objucxdef *)0;

    /* set up vocabulary context */
    vocini(&vocctx, ec, mctx, &runctx, undoptr, 100, 100, 200);

    /*
     *   save a pointer to the voc context globally, so that certain
     *   external routines (such as Unix-style signal handlers) can reach
     *   it 
     */
    main_voc_ctx = &vocctx;
    
    /* allocate stack and heap */
    totsize = (ulong)stksiz * (ulong)sizeof(runsdef);
    if (totsize != (size_t)totsize)
        errsig1(ec, ERR_STKSIZE, ERRTINT, (uint)(65535/sizeof(runsdef)));
    mystack = (runsdef *)mchalo(ec, (size_t)totsize, "runtime stack");
    myheap = mchalo(ec, heapsiz, "runtime heap");

    /* get the absolute path for the input file */
    if (infile != 0)
        os_get_abs_filename(infile_abs, sizeof(infile_abs), infile);
    else if (exefile != 0)
        os_get_abs_filename(infile_abs, sizeof(infile_abs), exefile);
    else
        infile_abs[0] = '\0';
    os_get_path_name(infile_path, sizeof(infile_path), infile_abs);

    /* set up execution context */
    runctx.runcxerr = ec;
    runctx.runcxmem = mctx;
    runctx.runcxstk = mystack;
    runctx.runcxstop = &mystack[stksiz];
    runctx.runcxsp = mystack;
    runctx.runcxbp = mystack;
    runctx.runcxheap = myheap;
    runctx.runcxhp = myheap;
    runctx.runcxhtop = &myheap[heapsiz];
    runctx.runcxundo = undoptr;
    runctx.runcxbcx = &bifctx;
    runctx.runcxbi = bif;
    runctx.runcxtio = (tiocxdef *)0;
    runctx.runcxdbg = &dbg;
    runctx.runcxvoc = &vocctx;
    runctx.runcxdmd = supcont;
    runctx.runcxdmc = &supctx;
    runctx.runcxext = 0;
    runctx.runcxgamename = infile;
    runctx.runcxgamepath = infile_path;

    /* set up setup context */
    supctx.supcxerr = ec;
    supctx.supcxmem = mctx;
    supctx.supcxtab = (tokthdef *)0;
    supctx.supcxbuf = (uchar *)0;
    supctx.supcxlen = 0;
    supctx.supcxvoc = &vocctx;
    supctx.supcxrun = &runctx;
    
    /* set up debug context */
    dbg.dbgcxtio = (tiocxdef *)0;
    dbg.dbgcxmem = mctx;
    dbg.dbgcxerr = ec;
    dbg.dbgcxtab = (tokthdef *)0;
    dbg.dbgcxfcn = 0;
    dbg.dbgcxdep = 0;
    dbg.dbgcxflg = 0;
    dbg.dbgcxlin = (lindef *)0;                      /* no line sources yet */
    
    /* set up built-in function context */
    CLRSTRUCT(bifctx);
    bifctx.bifcxerr = ec;
    bifctx.bifcxrun = &runctx;
    bifctx.bifcxtio = (tiocxdef *)0;
    bifctx.bifcxrnd = 0;
    bifctx.bifcxrndset = FALSE;
    bifctx.bifcxappctx = appctx;
    bifctx.bifcxsafetyr = safety_read;
    bifctx.bifcxsafetyw = safety_write;
    bifctx.bifcxsavext = save_ext;

    /* initialize the regular expression parser context */
    re_init(&bifctx.bifcxregex, ec);
    
    /* add the built-in functions, keywords, etc */
    supbif(&supctx, bif, (int)(sizeof(bif)/sizeof(bif[0])));
    
    /* set up status line hack */
    runistat(&vocctx, &runctx, (tiocxdef *)0);

    /* turn on the "busy" cursor before loading */
    os_csr_busy(TRUE);
    
    /* read the game from the binary file */
    fiord(mctx, &vocctx, (struct tokcxdef *)0,
          infile, exefile, &fiolctx, &preinit, &flags,
          (struct tokpdef *)0, (uchar **)0, (uint *)0, (uint *)0,
          (preload ? 2 : 0), appctx, argv[0]);
    loadopen = TRUE;

    /* turn off the "busy" cursor */
    os_csr_busy(FALSE);
    
    /* play the game */
    plygo(&runctx, &vocctx, (tiocxdef *)0, preinit, restore_file);
    
    /* close load file */
    fiorcls(&fiolctx);
    
    if (pause)
    {
        trdptf("[press a key to exit]");
        os_waitc();
        trdptf("\n");
    }
    
    /* close and delete swapfile, if one was opened */
    trd_close_swapfile(&runctx);

    /* make sure the script file is closed, if we have one */
    qasclose();

    ERRCLEAN(ec)
        /* close and delete swapfile, if one was opened */
        trd_close_swapfile(&runctx);
        
        /* close the load file if one was opened */
        if (loadopen)
            fiorcls(&fiolctx);

        /* vocctx is going out of scope - forget the global reference to it */
        main_voc_ctx = 0;

        /* delete the voc context */
        vocterm(&vocctx);

        /* delete the undo context */
        if (undoptr != 0)
            objuterm(undoptr);

        /* release the object cache structures */
        if (mctx != 0)
            mcmcterm(mctx);
        if (globalctx != 0)
            mcmterm(globalctx);
    ERRENDCLN(ec)

    /* vocctx is going out of scope - forget the global reference to it */
    main_voc_ctx = 0;

    /* delete the voc contxt */
    vocterm(&vocctx);

    /* delete the undo context */
    if (undoptr != 0)
        objuterm(undoptr);

    /* release the object cache structures */
    mcmcterm(mctx);
    mcmterm(globalctx);
}